

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

void __thiscall HandleManager::sessionClosed(HandleManager *this,CK_SESSION_HANDLE hSession)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr slotID;
  _Base_ptr p_Var2;
  _Self __tmp;
  iterator iVar3;
  long lVar4;
  pair<std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>,_std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>_>
  pVar5;
  MutexLocker lock;
  MutexLocker local_40;
  
  MutexLocker::MutexLocker(&local_40,this->handlesMutex);
  p_Var2 = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
    iVar3._M_node = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var2 + 1) >= hSession) {
        iVar3._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < hSession];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)iVar3._M_node != p_Var1) && (*(ulong *)(iVar3._M_node + 1) <= hSession)
        ) && (iVar3._M_node[1]._M_parent == (_Base_ptr)0x1)) {
      slotID = iVar3._M_node[1]._M_left;
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
                          *)&this->handles,iVar3);
      iVar3._M_node = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
        lVar4 = 0;
        do {
          if (iVar3._M_node[1]._M_parent == (_Base_ptr)0x2) {
            if (iVar3._M_node[1]._M_right != (_Base_ptr)hSession) goto LAB_00163405;
            pVar5 = std::
                    _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::equal_range(&(this->objects)._M_t,(key_type *)(iVar3._M_node + 2));
            std::
            _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
            ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar5.first._M_node,
                           (_Base_ptr)pVar5.second._M_node);
            p_Var2 = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
                                *)&this->handles,iVar3);
          }
          else {
            if (iVar3._M_node[1]._M_parent == (_Base_ptr)0x1) {
              lVar4 = lVar4 + (ulong)(slotID == iVar3._M_node[1]._M_left);
            }
LAB_00163405:
            p_Var2 = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
          }
          iVar3._M_node = p_Var2;
        } while ((_Rb_tree_header *)p_Var2 != p_Var1);
        if (lVar4 != 0) goto LAB_00163431;
      }
      allSessionsClosed(this,(CK_SLOT_ID)slotID,true);
    }
  }
LAB_00163431:
  MutexLocker::~MutexLocker(&local_40);
  return;
}

Assistant:

void HandleManager::sessionClosed(const CK_SESSION_HANDLE hSession)
{
	CK_SLOT_ID slotID;
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hSession);
	if (it == handles.end() || CKH_SESSION != it->second.kind)
		return; // Unable to find the specified session.

	slotID = it->second.slotID;

	// session closed, so we can erase information about it.
	handles.erase(it);

	// Erase all session object handles associated with the given session handle.
	CK_ULONG openSessionCount = 0;
	for (it = handles.begin(); it != handles.end(); ) {
		Handle &h = it->second;
		if (CKH_SESSION == h.kind && slotID == h.slotID) {
			++openSessionCount; // another session is open for this slotID.
		} else {
			if (CKH_OBJECT == h.kind && hSession == h.hSession) {
				// A session object is present for the given session, so erase it.
				objects.erase(it->second.object);
				// Iterator post-incrementing (it++) will return a copy of the original it (which points to handle to be deleted).
				handles.erase(it++);
				continue;
			}
		}
		++it;
	}

	 // We are done when there are still sessions open.
	if (openSessionCount)
		return;

	// No more sessions open for this token, so remove all object handles that are still valid for the given slotID.
	allSessionsClosed(slotID, true);
}